

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

_Bool signal_end_worker_thread
                (TRANSPORT_HANDLE_DATA *transportData,IOTHUB_CLIENT_CORE_HANDLE clientHandle)

{
  LOCK_RESULT LVar1;
  LOGGER_LOG p_Var2;
  void *elements;
  size_t sVar3;
  LOGGER_LOG l_1;
  void *element;
  LOGGER_LOG l;
  _Bool okToJoin;
  IOTHUB_CLIENT_CORE_HANDLE clientHandle_local;
  TRANSPORT_HANDLE_DATA *transportData_local;
  
  LVar1 = Lock(transportData->clientsLockHandle);
  if (LVar1 == LOCK_OK) {
    elements = VECTOR_find_if(transportData->clients,find_by_handle,clientHandle);
    if (elements != (void *)0x0) {
      VECTOR_erase(transportData->clients,elements,1);
    }
    if (transportData->workerThreadHandle == (THREAD_HANDLE)0x0) {
      l._7_1_ = false;
    }
    else {
      sVar3 = VECTOR_size(transportData->clients);
      l._7_1_ = sVar3 == 0;
      if (l._7_1_) {
        stop_worker_thread(transportData);
      }
    }
    LVar1 = Unlock(transportData->clientsLockHandle);
    if ((LVar1 != LOCK_OK) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"signal_end_worker_thread",0x143,1,"failed to unlock on signal_end_worker_thread");
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"signal_end_worker_thread",0x126,1,"failed to lock for signal_end_worker_thread");
    }
    l._7_1_ = false;
  }
  return l._7_1_;
}

Assistant:

static bool signal_end_worker_thread(TRANSPORT_HANDLE_DATA * transportData, IOTHUB_CLIENT_CORE_HANDLE clientHandle)
{
    bool okToJoin;

    if (Lock(transportData->clientsLockHandle) != LOCK_OK)
    {
        LogError("failed to lock for signal_end_worker_thread");
        okToJoin = false;
    }
    else
    {
        void* element = VECTOR_find_if(transportData->clients, find_by_handle, clientHandle);
        if (element != NULL)
        {
            VECTOR_erase(transportData->clients, element, 1);
        }
        if (transportData->workerThreadHandle != NULL)
        {
            if (VECTOR_size(transportData->clients) == 0)
            {
                stop_worker_thread(transportData);
                okToJoin = true;
            }
            else
            {
                okToJoin = false;
            }
        }
        else
        {
            okToJoin = false;
        }

        if (Unlock(transportData->clientsLockHandle) != LOCK_OK)
        {
            LogError("failed to unlock on signal_end_worker_thread");
        }
    }
    return okToJoin;
}